

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::FirstState<float>,float,duckdb::FirstFunction<false,false>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  byte bVar8;
  idx_t iVar9;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar4 = 0;
      uVar5 = 0;
      do {
        uVar7 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar7 = count;
        }
        if (uVar5 < uVar7) {
          bVar8 = state[4];
          do {
            if ((bVar8 & 1) == 0) {
              if ((puVar2 == (unsigned_long *)0x0) ||
                 ((puVar2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
                state[4] = '\x01';
                state[5] = '\0';
                *(undefined4 *)state = *(undefined4 *)(pdVar1 + uVar5 * 4);
              }
              else {
                state[4] = '\x01';
                state[5] = '\x01';
              }
              bVar8 = 1;
            }
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    if (state[4] == '\0') {
      pdVar1 = input->data;
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
        state[4] = '\x01';
        state[5] = '\0';
        *(undefined4 *)state = *(undefined4 *)pdVar1;
      }
      else {
        state[4] = '\x01';
        state[5] = '\x01';
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (count != 0) {
      psVar3 = (local_68.sel)->sel_vector;
      bVar8 = state[4];
      iVar6 = 0;
      do {
        iVar9 = iVar6;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar6];
        }
        if ((bVar8 & 1) == 0) {
          if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
            state[4] = '\x01';
            state[5] = '\0';
            *(undefined4 *)state = *(undefined4 *)(local_68.data + iVar9 * 4);
          }
          else {
            state[4] = '\x01';
            state[5] = '\x01';
          }
          bVar8 = 1;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}